

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::registerdirblock(ImgfsFile *this,uint64_t ofs)

{
  undefined8 *puVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  key_type local_1c;
  uint64_t uStack_18;
  uint fileblocknr;
  uint64_t ofs_local;
  ImgfsFile *this_local;
  
  uStack_18 = ofs;
  ofs_local = (uint64_t)this;
  if (ofs / (this->_hdr).bytesperblock >> 0x20 != 0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "registerdirblock: offset too large";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  local_1c = (key_type)(ofs / (this->_hdr).bytesperblock);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_dir2file);
  pmVar3 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->_file2dir,&local_1c);
  *pmVar3 = (mapped_type)sVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_dir2file,&local_1c);
  return;
}

Assistant:

void registerdirblock(uint64_t ofs)
    {
        if ((ofs/_hdr.bytesperblock)>>32)
            throw "registerdirblock: offset too large";
        unsigned fileblocknr= unsigned(ofs/_hdr.bytesperblock);

        _file2dir[fileblocknr]= _dir2file.size();
        _dir2file.push_back(fileblocknr);
    }